

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  byte bVar1;
  u32 uVar2;
  u8 *puVar3;
  ushort uVar4;
  u8 uVar5;
  uint uVar6;
  int iVar7;
  int iPtrEnd;
  uchar *data;
  u32 iEnd;
  u32 iLast;
  u16 iOrigSize;
  u8 nFrag;
  u8 hdr;
  u16 iFreeBlk;
  u16 iPtr;
  u16 iSize_local;
  u16 iStart_local;
  MemPage *pPage_local;
  
  iEnd._2_1_ = 0;
  uVar2 = pPage->pBt->usableSize;
  data._4_4_ = (uint)iStart + (uint)iSize;
  puVar3 = pPage->aData;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar3 + iStart,0,(ulong)iSize);
  }
  bVar1 = pPage->hdrOffset;
  iLast._2_2_ = bVar1 + 1;
  uVar4 = iLast._2_2_;
  iOrigSize = iSize;
  _nFrag = iStart;
  if ((puVar3[(int)(iLast._2_2_ + 1)] == '\0') && (puVar3[iLast._2_2_] == '\0')) {
    iLast._0_2_ = 0;
  }
  else {
    do {
      iLast._2_2_ = uVar4;
      uVar5 = puVar3[(ulong)iLast._2_2_ + 1];
      iLast._0_2_ = CONCAT11(puVar3[iLast._2_2_],uVar5);
      if (iStart <= CONCAT11(puVar3[iLast._2_2_],uVar5)) goto LAB_00417799;
      uVar4 = (ushort)iLast;
    } while (iLast._2_2_ + 4 <= (uint)(ushort)iLast);
    if ((ushort)iLast != 0) {
      iVar7 = sqlite3CorruptError(0xef25);
      return iVar7;
    }
LAB_00417799:
    if (uVar2 - 4 < (uint)(ushort)iLast) {
      iVar7 = sqlite3CorruptError(0xef29);
      return iVar7;
    }
    if (((ushort)iLast != 0) && ((uint)(ushort)iLast <= data._4_4_ + 3)) {
      iEnd._2_1_ = uVar5 - (char)data._4_4_;
      if ((ushort)iLast < data._4_4_) {
        iVar7 = sqlite3CorruptError(0xef34);
        return iVar7;
      }
      data._4_4_ = (uint)(ushort)iLast +
                   (uint)CONCAT11(puVar3[(int)((ushort)iLast + 2)],
                                  puVar3[(long)(int)((ushort)iLast + 2) + 1]);
      if (pPage->pBt->usableSize < data._4_4_) {
        iVar7 = sqlite3CorruptError(0xef37);
        return iVar7;
      }
      iOrigSize = (short)data._4_4_ - iStart;
      iLast._0_2_ = CONCAT11(puVar3[(ushort)iLast],puVar3[(ulong)(ushort)iLast + 1]);
    }
    if (((ushort)(bVar1 + 1) < iLast._2_2_) &&
       (uVar6 = (uint)iLast._2_2_ +
                (uint)CONCAT11(puVar3[(int)(iLast._2_2_ + 2)],
                               puVar3[(long)(int)(iLast._2_2_ + 2) + 1]), (uint)iStart <= uVar6 + 3)
       ) {
      if (iStart < uVar6) {
        iVar7 = sqlite3CorruptError(0xef44);
        return iVar7;
      }
      iEnd._2_1_ = iEnd._2_1_ + ((char)iStart - (char)uVar6);
      iOrigSize = (short)data._4_4_ - iLast._2_2_;
      _nFrag = iLast._2_2_;
    }
    if (puVar3[(int)(bVar1 + 7)] < iEnd._2_1_) {
      iVar7 = sqlite3CorruptError(0xef4a);
      return iVar7;
    }
    puVar3[(int)(bVar1 + 7)] = puVar3[(int)(bVar1 + 7)] - iEnd._2_1_;
  }
  uVar5 = (u8)((ushort)iLast >> 8);
  if (_nFrag == CONCAT11(puVar3[(int)(bVar1 + 5)],puVar3[(long)(int)(bVar1 + 5) + 1])) {
    if (iLast._2_2_ != (ushort)(bVar1 + 1)) {
      iVar7 = sqlite3CorruptError(0xef51);
      return iVar7;
    }
    puVar3[(int)(bVar1 + 1)] = uVar5;
    puVar3[(long)(int)(bVar1 + 1) + 1] = (u8)(ushort)iLast;
    puVar3[(int)(bVar1 + 5)] = (u8)(data._4_4_ >> 8);
    puVar3[(long)(int)(bVar1 + 5) + 1] = (u8)data._4_4_;
  }
  else {
    puVar3[iLast._2_2_] = (u8)(_nFrag >> 8);
    puVar3[(ulong)iLast._2_2_ + 1] = (u8)_nFrag;
    puVar3[_nFrag] = uVar5;
    puVar3[(ulong)_nFrag + 1] = (u8)(ushort)iLast;
    puVar3[(int)(_nFrag + 2)] = (u8)(iOrigSize >> 8);
    puVar3[(long)(int)(_nFrag + 2) + 1] = (u8)iOrigSize;
  }
  pPage->nFree = pPage->nFree + iSize;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u32 iLast = pPage->pBt->usableSize-4; /* Largest possible freeblock offset */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=iLast );

  /* Overwrite deleted information with zeros when the secure_delete
  ** option is enabled */
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[iStart], 0, iSize);
  }

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>iLast ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    data[hdr+7] -= nFrag;
  }
  if( iStart==get2byte(&data[hdr+5]) ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
    put2byte(&data[iStart], iFreeBlk);
    put2byte(&data[iStart+2], iSize);
  }
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}